

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

int Sbl_ManComputeCuts(Sbl_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  word *pwVar6;
  Vec_Wrd_t *pVVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  uint uVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  ulong uVar13;
  Vec_Int_t *pVVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  Vec_Wrd_t *pVVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong Entry;
  ulong Entry_00;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  word wVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong Entry_01;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong Entry_02;
  timespec ts;
  timespec local_90;
  Gia_Obj_t *local_80;
  long local_78;
  ulong local_70;
  long local_68;
  long local_60;
  word *local_58;
  word *local_50;
  word *local_48;
  word *local_40;
  long local_38;
  
  iVar9 = clock_gettime(3,&local_90);
  if (iVar9 < 0) {
    lVar16 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
    lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_90.tv_sec * -1000000;
  }
  pVVar14 = p->vLeaves;
  iVar9 = pVVar14->nSize;
  if (iVar9 < 0x81) {
    pVVar11 = p->vAnds;
    iVar15 = pVVar11->nSize;
    if (iVar15 <= p->nVars) {
      p->vCutsStart->nSize = 0;
      p->vCutsObj->nSize = 0;
      p->vCutsNum->nSize = 0;
      p->vCutsI1->nSize = 0;
      p->vCutsI2->nSize = 0;
      p->vCutsN1->nSize = 0;
      p->vCutsN2->nSize = 0;
      if (0 < pVVar14->nSize) {
        uVar20 = 0;
        do {
          iVar19 = pVVar14->pArray[uVar20];
          if (((long)iVar19 < 0) || (p->pGia->nObjs <= iVar19)) goto LAB_007b01f8;
          pGVar4 = p->pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          Vec_IntPush(p->vCutsStart,p->vCutsI1->nSize);
          Vec_IntPush(p->vCutsObj,-1);
          Vec_IntPush(p->vCutsNum,1);
          if (uVar20 < 0x40) {
            Vec_WrdPush(p->vCutsI1,1L << ((byte)uVar20 & 0x3f));
            pVVar18 = p->vCutsI2;
            wVar26 = 0;
          }
          else {
            Vec_WrdPush(p->vCutsI1,0);
            pVVar18 = p->vCutsI2;
            wVar26 = 1L << ((byte)uVar20 & 0x3f);
          }
          Vec_WrdPush(pVVar18,wVar26);
          Vec_WrdPush(p->vCutsN1,0);
          Vec_WrdPush(p->vCutsN2,0);
          pGVar4[iVar19].Value = (uint)uVar20;
          uVar20 = uVar20 + 1;
          pVVar14 = p->vLeaves;
        } while ((long)uVar20 < (long)pVVar14->nSize);
        pVVar11 = p->vAnds;
      }
      if (0 < pVVar11->nSize) {
        uVar20 = 0;
        do {
          iVar19 = pVVar11->pArray[uVar20];
          if (((long)iVar19 < 0) || (p->pGia->nObjs <= iVar19)) goto LAB_007b01f8;
          pGVar4 = p->pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          pGVar4 = pGVar4 + iVar19;
          uVar10 = (uint)*(undefined8 *)pGVar4;
          if (((int)uVar10 < 0) || (uVar10 = uVar10 & 0x1fffffff, uVar10 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,0x301,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
          }
          uVar10 = pGVar4[-(ulong)uVar10].Value;
          uVar12 = (ulong)uVar10;
          if (uVar12 == 0xffffffff) {
            __assert_fail("~Gia_ObjFanin0(pObj)->Value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,0x302,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
          }
          uVar27 = pGVar4[-(ulong)((uint)((ulong)*(undefined8 *)pGVar4 >> 0x20) & 0x1fffffff)].Value
          ;
          uVar13 = (ulong)uVar27;
          if (uVar13 == 0xffffffff) {
            __assert_fail("~Gia_ObjFanin1(pObj)->Value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,0x303,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
          }
          if ((int)uVar10 < 0) goto LAB_007b0236;
          pVVar14 = p->vCutsStart;
          if (((pVVar14->nSize <= (int)uVar10) || ((int)uVar27 < 0)) ||
             ((uint)pVVar14->nSize <= uVar27)) goto LAB_007b0236;
          uVar1 = p->vCutsNum->nSize;
          if (((int)uVar1 <= (int)uVar10) || (uVar1 <= uVar27)) goto LAB_007b0236;
          local_80 = pGVar4;
          if (uVar20 == 0x80) {
            __assert_fail("Obj >= 0 && Obj < 128",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,0x2ab,"void Sbl_ManComputeCutsOne(Sbl_Man_t *, int, int, int)");
          }
          pVVar18 = p->vCutsI1;
          local_40 = pVVar18->pArray;
          local_48 = p->vCutsI2->pArray;
          local_50 = p->vCutsN1->pArray;
          local_58 = p->vCutsN2->pArray;
          iVar19 = pVVar14->pArray[uVar12];
          lVar30 = (long)iVar19;
          iVar2 = pVVar14->pArray[uVar13];
          lVar28 = (long)iVar2;
          piVar5 = p->vCutsNum->pArray;
          iVar3 = piVar5[uVar12];
          uVar10 = piVar5[uVar13];
          p->vTempI1->nSize = 0;
          p->vTempI2->nSize = 0;
          p->vTempN1->nSize = 0;
          p->vTempN2->nSize = 0;
          if (0 < iVar3) {
            local_68 = (long)(int)(uVar10 + iVar2);
            local_78 = (long)(iVar3 + iVar19);
            local_70 = (ulong)uVar10;
            local_60 = lVar28;
            do {
              lVar35 = lVar28;
              if (0 < (int)local_70) {
                do {
                  local_38 = lVar30;
                  if (6 < p->LutSize) {
                    __assert_fail("LutSize <= 6",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                                  ,0x274,"int Sbl_CutIsFeasible(word, word, word, word, int)");
                  }
                  Entry_00 = local_40[lVar35] | local_40[local_38];
                  Entry = local_48[lVar35] | local_48[local_38];
                  Entry_01 = local_50[lVar35] | local_50[local_38];
                  Entry_02 = local_58[lVar35] | local_58[local_38];
                  uVar23 = Entry_00 - 1 & Entry_00;
                  uVar12 = Entry - 1 & Entry;
                  uVar29 = Entry_01 - 1 & Entry_01;
                  uVar21 = uVar23 - 1 & uVar23;
                  uVar38 = Entry_02 - 1 & Entry_02;
                  uVar24 = uVar12 - 1 & uVar12;
                  uVar33 = uVar29 - 1 & uVar29;
                  uVar17 = uVar21 - 1 & uVar21;
                  uVar36 = uVar38 - 1 & uVar38;
                  uVar22 = uVar24 - 1 & uVar24;
                  uVar39 = uVar33 - 1 & uVar33;
                  uVar32 = uVar36 - 1 & uVar36;
                  uVar13 = uVar17 - 1 & uVar17;
                  uVar25 = uVar22 - 1 & uVar22;
                  uVar31 = uVar39 - 1 & uVar39;
                  uVar34 = uVar32 - 1 & uVar32;
                  uVar10 = (uint)(uVar34 != 0) + (uint)(uVar31 != 0) +
                           (uint)(uVar25 != 0) +
                           (uint)(uVar33 != 0) +
                           (uint)(uVar17 != 0) +
                           (uint)(uVar29 != 0) +
                           (uint)(uVar21 != 0) +
                           (uint)(Entry != 0) + (uint)(Entry_00 != 0) + (uint)(uVar23 != 0) +
                           (uint)(Entry_01 != 0) + (uint)(uVar12 != 0) + (uint)(Entry_02 != 0) +
                           (uint)(uVar24 != 0) + (uint)(uVar38 != 0) + (uint)(uVar22 != 0) +
                           (uint)(uVar13 != 0) + (uint)(uVar36 != 0) + (uint)(uVar39 != 0) +
                           (uint)(uVar32 != 0);
                  if (p->LutSize < 5) {
                    if (uVar10 < 5) {
LAB_007af90c:
                      pVVar18 = p->vTempI1;
                      pVVar7 = p->vTempN1;
                      uVar10 = pVVar18->nSize;
                      if (uVar10 != pVVar7->nSize) {
                        __assert_fail("vCutsI1->nSize == vCutsN1->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                                      ,0x282,
                                      "int Sbl_CutPushUncontained(Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, word, word, word, word)"
                                     );
                      }
                      p_00 = p->vTempI2;
                      p_01 = p->vTempN2;
                      iVar19 = p_00->nSize;
                      if (iVar19 != p_01->nSize) {
                        __assert_fail("vCutsI2->nSize == vCutsN2->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                                      ,0x283,
                                      "int Sbl_CutPushUncontained(Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, Vec_Wrd_t *, word, word, word, word)"
                                     );
                      }
                      if ((int)uVar10 < 1) {
                        uVar27 = 0;
                      }
                      else {
                        pwVar6 = pVVar18->pArray;
                        uVar12 = 0;
                        do {
                          if ((((pwVar6[uVar12] & ~Entry_00) == 0) &&
                              ((p_00->pArray[uVar12] & ~Entry) == 0)) &&
                             (((pVVar7->pArray[uVar12] & ~Entry_01) == 0 &&
                              ((p_01->pArray[uVar12] & ~Entry_02) == 0)))) goto LAB_007afa9d;
                          uVar12 = uVar12 + 1;
                        } while (uVar10 != uVar12);
                        uVar12 = 0;
                        uVar27 = 0;
                        do {
                          if (((((Entry_00 & ~pwVar6[uVar12]) != 0) ||
                               ((Entry & ~p_00->pArray[uVar12]) != 0)) ||
                              ((Entry_01 & ~pVVar7->pArray[uVar12]) != 0)) ||
                             ((Entry_02 & ~p_01->pArray[uVar12]) != 0)) {
                            if (uVar10 <= uVar27) {
LAB_007b015d:
                              __assert_fail("i >= 0 && i < p->nSize",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                            ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)")
                              ;
                            }
                            pwVar6[uVar27] = pwVar6[uVar12];
                            if (iVar19 <= (int)uVar27) goto LAB_007b015d;
                            p_00->pArray[uVar27] = p_00->pArray[uVar12];
                            pVVar7->pArray[uVar27] = pVVar7->pArray[uVar12];
                            p_01->pArray[uVar27] = p_01->pArray[uVar12];
                            uVar27 = uVar27 + 1;
                          }
                          uVar12 = uVar12 + 1;
                        } while (uVar10 != uVar12);
                      }
                      if ((((int)uVar10 < (int)uVar27) ||
                          (pVVar18->nSize = uVar27, p_00->nSize < (int)uVar27)) ||
                         ((p_00->nSize = uVar27, pVVar7->nSize < (int)uVar27 ||
                          (pVVar7->nSize = uVar27, p_01->nSize < (int)uVar27)))) {
                        __assert_fail("p->nSize >= nSizeNew",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                      ,0x276,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
                      }
                      p_01->nSize = uVar27;
                      Vec_WrdPush(pVVar18,Entry_00);
                      Vec_WrdPush(p_00,Entry);
                      Vec_WrdPush(pVVar7,Entry_01);
                      Vec_WrdPush(p_01,Entry_02);
                    }
                  }
                  else {
                    uVar13 = uVar13 - 1 & uVar13;
                    uVar25 = uVar25 - 1 & uVar25;
                    uVar31 = uVar31 - 1 & uVar31;
                    uVar34 = uVar34 - 1 & uVar34;
                    if ((((((((((uint)((uVar13 & uVar13 - 1) != 0) - (uint)(uVar13 == 0)) -
                              (uint)(uVar25 == 0)) - (uint)((uVar25 - 1 & uVar25) == 0)) -
                            (uint)(uVar31 == 0)) - (uint)((uVar31 - 1 & uVar31) == 0)) -
                          (uint)(uVar34 == 0)) + 7) - (uint)((uVar34 - 1 & uVar34) == 0)) + uVar10 <
                        7) goto LAB_007af90c;
                  }
LAB_007afa9d:
                  lVar35 = lVar35 + 1;
                  lVar28 = local_60;
                  lVar30 = local_38;
                } while (lVar35 < local_68);
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 < local_78);
            pVVar18 = p->vCutsI1;
            pVVar14 = p->vCutsStart;
          }
          Vec_IntPush(pVVar14,pVVar18->nSize);
          Vec_IntPush(p->vCutsNum,p->vTempI1->nSize + 1);
          pVVar18 = p->vTempI1;
          if (0 < pVVar18->nSize) {
            pVVar7 = p->vCutsI1;
            lVar28 = 0;
            do {
              Vec_WrdPush(pVVar7,pVVar18->pArray[lVar28]);
              lVar28 = lVar28 + 1;
            } while (lVar28 < pVVar18->nSize);
          }
          pVVar18 = p->vTempI2;
          if (0 < pVVar18->nSize) {
            pVVar7 = p->vCutsI2;
            lVar28 = 0;
            do {
              Vec_WrdPush(pVVar7,pVVar18->pArray[lVar28]);
              lVar28 = lVar28 + 1;
            } while (lVar28 < pVVar18->nSize);
          }
          pVVar18 = p->vTempN1;
          if (0 < pVVar18->nSize) {
            pVVar7 = p->vCutsN1;
            lVar28 = 0;
            do {
              Vec_WrdPush(pVVar7,pVVar18->pArray[lVar28]);
              lVar28 = lVar28 + 1;
            } while (lVar28 < pVVar18->nSize);
          }
          pVVar18 = p->vTempN2;
          if (0 < pVVar18->nSize) {
            pVVar7 = p->vCutsN2;
            lVar28 = 0;
            do {
              Vec_WrdPush(pVVar7,pVVar18->pArray[lVar28]);
              lVar28 = lVar28 + 1;
            } while (lVar28 < pVVar18->nSize);
          }
          Vec_WrdPush(p->vCutsI1,0);
          Vec_WrdPush(p->vCutsI2,0);
          if (uVar20 < 0x40) {
            Vec_WrdPush(p->vCutsN1,1L << ((byte)uVar20 & 0x3f));
            pVVar18 = p->vCutsN2;
            wVar26 = 0;
          }
          else {
            Vec_WrdPush(p->vCutsN1,0);
            pVVar18 = p->vCutsN2;
            wVar26 = 1L << ((byte)uVar20 & 0x3f);
          }
          Vec_WrdPush(pVVar18,wVar26);
          if (-1 < p->vTempI1->nSize) {
            iVar19 = -1;
            do {
              Vec_IntPush(p->vCutsObj,(int)uVar20);
              iVar19 = iVar19 + 1;
            } while (iVar19 < p->vTempI1->nSize);
          }
          local_80->Value = p->vLeaves->nSize + (int)uVar20;
          uVar20 = uVar20 + 1;
          pVVar11 = p->vAnds;
        } while ((long)uVar20 < (long)pVVar11->nSize);
      }
      iVar15 = iVar15 + iVar9;
      if (p->vCutsStart->nSize != iVar15) {
        __assert_fail("Vec_IntSize(p->vCutsStart) == nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x307,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      if (p->vCutsNum->nSize != iVar15) {
        __assert_fail("Vec_IntSize(p->vCutsNum) == nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x308,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      iVar9 = p->vCutsI1->nSize;
      if (iVar9 != p->vCutsN1->nSize) {
        __assert_fail("Vec_WrdSize(p->vCutsI1) == Vec_WrdSize(p->vCutsN1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x309,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      if (p->vCutsI2->nSize != p->vCutsN2->nSize) {
        __assert_fail("Vec_WrdSize(p->vCutsI2) == Vec_WrdSize(p->vCutsN2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x30a,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      if (iVar9 != p->vCutsObj->nSize) {
        __assert_fail("Vec_WrdSize(p->vCutsI1) == Vec_IntSize(p->vCutsObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x30b,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      p->vRootVars->nSize = 0;
      pVVar14 = p->vRoots;
      if (0 < pVVar14->nSize) {
        lVar28 = 0;
        do {
          iVar9 = pVVar14->pArray[lVar28];
          lVar30 = (long)iVar9;
          if ((lVar30 < 0) || (pGVar8 = p->pGia, pGVar8->nObjs <= iVar9)) goto LAB_007b01f8;
          if (pGVar8->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = pGVar8->pObjs + lVar30;
          if ((~*(uint *)pGVar4 & 0x9fffffff) != 0) {
            if (pGVar8->vMapping2->nSize <= iVar9) goto LAB_007b0217;
            if (pGVar8->vMapping2->pArray[lVar30].nSize == 0) {
              __assert_fail("Gia_ObjIsLut2(p->pGia, Obj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                            ,0x313,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
            }
            uVar10 = pGVar4->Value;
            if (uVar10 == 0xffffffff) {
              __assert_fail("~pObj->Value",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                            ,0x314,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
            }
            Vec_IntPush(p->vRootVars,uVar10 - p->vLeaves->nSize);
            pVVar14 = p->vRoots;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 < pVVar14->nSize);
        pVVar11 = p->vAnds;
      }
      p->vPolar->nSize = 0;
      p->vSolInit->nSize = 0;
      uVar10 = pVVar11->nSize;
      uVar20 = (ulong)uVar10;
      if (0 < (int)uVar10) {
        lVar28 = 0;
        do {
          uVar10 = (uint)uVar20;
          iVar9 = pVVar11->pArray[lVar28];
          lVar30 = (long)iVar9;
          if ((lVar30 < 0) || (pGVar8 = p->pGia, pGVar8->nObjs <= iVar9)) goto LAB_007b01f8;
          if (pGVar8->pObjs == (Gia_Obj_t *)0x0) break;
          if (pGVar8->vMapping2->nSize <= iVar9) goto LAB_007b0217;
          if (pGVar8->vMapping2->pArray[lVar30].nSize != 0) {
            iVar15 = (int)lVar28;
            if (pGVar8->pObjs[lVar30].Value != p->vLeaves->nSize + iVar15) {
              __assert_fail("(int)pObj->Value == Vec_IntSize(p->vLeaves) + i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                            ,800,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
            }
            Vec_IntPush(p->vPolar,iVar15);
            Vec_IntPush(p->vSolInit,iVar15);
            pGVar8 = p->pGia;
            iVar19 = pGVar8->vMapping2->nSize;
            if (iVar19 <= iVar9) {
LAB_007b0217:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            pVVar14 = pGVar8->vMapping2->pArray;
            if ((long)pVVar14[lVar30].nSize < 1) {
              iVar9 = p->vLeaves->nSize;
              wVar26 = 0;
              uVar13 = 0;
              uVar12 = 0;
              uVar20 = 0;
            }
            else {
              lVar35 = 0;
              uVar20 = 0;
              uVar12 = 0;
              uVar13 = 0;
              wVar26 = 0;
              do {
                iVar2 = pVVar14[lVar30].pArray[lVar35];
                lVar37 = (long)iVar2;
                if ((lVar37 < 0) || (pGVar8->nObjs <= iVar2)) goto LAB_007b01f8;
                uVar10 = pGVar8->pObjs[lVar37].Value;
                iVar9 = p->vLeaves->nSize;
                if ((int)uVar10 < iVar9) {
                  if (uVar10 != 0xffffffff) {
                    if ((int)uVar10 < 0x40) {
                      wVar26 = wVar26 | 1L << ((ulong)uVar10 & 0x3f);
                    }
                    else {
                      uVar13 = uVar13 | 1L << ((ulong)(byte)((char)uVar10 - 0x40) & 0x3f);
                    }
                  }
                }
                else {
                  if (iVar19 <= iVar2) goto LAB_007b0217;
                  if (pVVar14[lVar37].nSize == 0) {
                    __assert_fail("(int)pFanin->Value < Vec_IntSize(p->vLeaves) || Gia_ObjIsLut2(p->pGia, Fanin)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                                  ,0x32a,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
                  }
                  if (uVar10 != 0xffffffff) {
                    uVar10 = uVar10 - iVar9;
                    if (uVar10 < 0x40) {
                      uVar12 = uVar12 | 1L << ((ulong)uVar10 & 0x3f);
                    }
                    else {
                      uVar20 = uVar20 | 1L << ((ulong)(byte)((char)uVar10 - 0x40) & 0x3f);
                    }
                  }
                }
                lVar35 = lVar35 + 1;
              } while (pVVar14[lVar30].nSize != lVar35);
            }
            uVar10 = iVar9 + iVar15;
            if ((((int)uVar10 < 0) || (p->vCutsStart->nSize <= (int)uVar10)) ||
               (p->vCutsNum->nSize <= (int)uVar10)) {
LAB_007b0236:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar30 = (long)p->vCutsNum->pArray[uVar10];
            if (0 < lVar30) {
              lVar35 = (long)p->vCutsStart->pArray[uVar10];
              lVar30 = lVar30 + lVar35;
              do {
                if (((p->vCutsI1->pArray[lVar35] == wVar26) &&
                    (p->vCutsI2->pArray[lVar35] == uVar13)) &&
                   ((p->vCutsN1->pArray[lVar35] == uVar12 && (p->vCutsN2->pArray[lVar35] == uVar20))
                   )) {
                  if (-1 < lVar35) {
                    Vec_IntPush(p->vPolar,(int)lVar35 + p->FirstVar);
                  }
                  break;
                }
                lVar35 = lVar35 + 1;
              } while (lVar35 < lVar30);
            }
          }
          lVar28 = lVar28 + 1;
          pVVar11 = p->vAnds;
          uVar10 = pVVar11->nSize;
          uVar20 = (ulong)(int)uVar10;
        } while (lVar28 < (long)uVar20);
      }
      lVar28 = (long)p->vLeaves->nSize;
      if (0 < lVar28) {
        pGVar8 = p->pGia;
        piVar5 = p->vLeaves->pArray;
        lVar30 = 0;
        do {
          iVar9 = piVar5[lVar30];
          if (((long)iVar9 < 0) || (pGVar8->nObjs <= iVar9)) goto LAB_007b01f8;
          pGVar4 = pGVar8->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          pGVar4[iVar9].Value = 0xffffffff;
          lVar30 = lVar30 + 1;
        } while (lVar28 != lVar30);
      }
      if (0 < (int)uVar10) {
        pGVar8 = p->pGia;
        piVar5 = pVVar11->pArray;
        uVar20 = 0;
        do {
          iVar9 = piVar5[uVar20];
          if (((long)iVar9 < 0) || (pGVar8->nObjs <= iVar9)) {
LAB_007b01f8:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar4 = pGVar8->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          pGVar4[iVar9].Value = 0xffffffff;
          uVar20 = uVar20 + 1;
        } while (uVar10 != uVar20);
      }
      iVar9 = clock_gettime(3,&local_90);
      if (iVar9 < 0) {
        lVar28 = -1;
      }
      else {
        lVar28 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
      }
      p->timeCut = p->timeCut + lVar28 + lVar16;
      return p->vCutsI1->nSize;
    }
  }
  __assert_fail("Vec_IntSize(p->vLeaves) <= 128 && Vec_IntSize(p->vAnds) <= p->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                ,0x2e2,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
}

Assistant:

int Sbl_ManComputeCuts( Sbl_Man_t * p )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; Vec_Int_t * vFanins;
    int i, k, Index, Fanin, nObjs = Vec_IntSize(p->vLeaves) + Vec_IntSize(p->vAnds);
    assert( Vec_IntSize(p->vLeaves) <= 128 && Vec_IntSize(p->vAnds) <= p->nVars );
    // assign leaf cuts
    Vec_IntClear( p->vCutsStart );
    Vec_IntClear( p->vCutsObj );
    Vec_IntClear( p->vCutsNum );
    Vec_WrdClear( p->vCutsI1 );
    Vec_WrdClear( p->vCutsI2 );
    Vec_WrdClear( p->vCutsN1 );
    Vec_WrdClear( p->vCutsN2 );
    Gia_ManForEachObjVec( p->vLeaves, p->pGia, pObj, i )
    {
        Vec_IntPush( p->vCutsStart, Vec_WrdSize(p->vCutsI1) );
        Vec_IntPush( p->vCutsObj, -1 );
        Vec_IntPush( p->vCutsNum, 1 );
        if ( i < 64 )
        {
            Vec_WrdPush( p->vCutsI1, (((word)1) << i) );
            Vec_WrdPush( p->vCutsI2, 0 );
        }
        else
        {
            Vec_WrdPush( p->vCutsI1, 0 );
            Vec_WrdPush( p->vCutsI2, (((word)1) << (i-64)) );
        }
        Vec_WrdPush( p->vCutsN1, 0 );
        Vec_WrdPush( p->vCutsN2, 0 );
        pObj->Value = i;
    }
    // assign internal cuts
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
    {
        assert( Gia_ObjIsAnd(pObj) );
        assert( ~Gia_ObjFanin0(pObj)->Value );
        assert( ~Gia_ObjFanin1(pObj)->Value );
        Sbl_ManComputeCutsOne( p, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value, i );
        pObj->Value = Vec_IntSize(p->vLeaves) + i;
    }
    assert( Vec_IntSize(p->vCutsStart) == nObjs );
    assert( Vec_IntSize(p->vCutsNum)   == nObjs );
    assert( Vec_WrdSize(p->vCutsI1)    == Vec_WrdSize(p->vCutsN1) );
    assert( Vec_WrdSize(p->vCutsI2)    == Vec_WrdSize(p->vCutsN2) );
    assert( Vec_WrdSize(p->vCutsI1)    == Vec_IntSize(p->vCutsObj) );
    // check that roots are mapped nodes
    Vec_IntClear( p->vRootVars );
    Gia_ManForEachObjVec( p->vRoots, p->pGia, pObj, i )
    {
        int Obj = Gia_ObjId(p->pGia, pObj);
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsLut2(p->pGia, Obj) );
        assert( ~pObj->Value );
        Vec_IntPush( p->vRootVars, pObj->Value - Vec_IntSize(p->vLeaves) );
    }
    // create current solution
    Vec_IntClear( p->vPolar );
    Vec_IntClear( p->vSolInit );
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
    {
        word CutI1 = 0, CutI2 = 0, CutN1 = 0, CutN2 = 0;
        int Obj = Gia_ObjId(p->pGia, pObj);
        if ( !Gia_ObjIsLut2(p->pGia, Obj) )
            continue;
        assert( (int)pObj->Value == Vec_IntSize(p->vLeaves) + i );
        // add node
        Vec_IntPush( p->vPolar, i );
        Vec_IntPush( p->vSolInit, i );
        // add its cut
        //Gia_LutForEachFaninObj( p->pGia, Obj, pFanin, k )
        vFanins = Gia_ObjLutFanins2( p->pGia, Obj );
        Vec_IntForEachEntry( vFanins, Fanin, k )
        {
            Gia_Obj_t * pFanin = Gia_ManObj( p->pGia, Fanin );
            assert( (int)pFanin->Value < Vec_IntSize(p->vLeaves) || Gia_ObjIsLut2(p->pGia, Fanin) );
//            if ( ~pFanin->Value == 0 )
//                Gia_ManPrintConeMulti( p->pGia, p->vAnds, p->vLeaves, p->vPath );
            if ( ~pFanin->Value == 0 ) 
                continue;
            assert( ~pFanin->Value );
            if ( (int)pFanin->Value < Vec_IntSize(p->vLeaves) )
            {
                if ( (int)pFanin->Value < 64 )
                    CutI1 |= ((word)1 << pFanin->Value);
                else
                    CutI2 |= ((word)1 << (pFanin->Value - 64));
            }
            else
            {
                if ( pFanin->Value - Vec_IntSize(p->vLeaves) < 64 )
                    CutN1 |= ((word)1 << (pFanin->Value - Vec_IntSize(p->vLeaves)));
                else
                    CutN2 |= ((word)1 << (pFanin->Value - Vec_IntSize(p->vLeaves) - 64));
            }
        }
        // find the new cut
        Index = Sbl_ManFindCut( p, Vec_IntSize(p->vLeaves) + i, CutI1, CutI2, CutN1, CutN2 );
        if ( Index < 0 )
        {
            //printf( "Cannot find the available cut.\n" );
            continue;
        }
        assert( Index >= 0 );
        Vec_IntPush( p->vPolar, p->FirstVar+Index );
    }
    // clean value
    Gia_ManForEachObjVec( p->vLeaves, p->pGia, pObj, i )
        pObj->Value = ~0;
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
        pObj->Value = ~0;
    p->timeCut += Abc_Clock() - clk;
    return Vec_WrdSize(p->vCutsI1);
}